

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfd.h
# Opt level: O1

void __thiscall pfd::settings::settings(settings *this,bool resync)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  char *pcVar3;
  undefined1 *puVar4;
  bool bVar5;
  string local_60;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  flags(pfd::settings::flag)::flags._0_1_ = !resync & (byte)flags(pfd::settings::flag)::flags;
  if ((byte)flags(pfd::settings::flag)::flags != 0) {
    return;
  }
  paVar1 = &local_60.field_2;
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"zenity","");
  flags(pfd::settings::flag)::flags._2_1_ = check_program(this,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"matedialog","");
  flags(pfd::settings::flag)::flags._3_1_ = check_program(this,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"qarma","");
  flags(pfd::settings::flag)::flags._4_1_ = check_program(this,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"kdialog","");
  flags(pfd::settings::flag)::flags._5_1_ = check_program(this,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((flags(pfd::settings::flag)::flags._2_1_ == '\x01') &&
     (flags(pfd::settings::flag)::flags._5_1_ == '\x01')) {
    pcVar3 = getenv("XDG_SESSION_DESKTOP");
    if (pcVar3 == (char *)0x0) {
      bVar5 = false;
    }
    else {
      local_60._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"gnome","");
      iVar2 = std::__cxx11::string::compare((char *)&local_60);
      bVar5 = iVar2 == 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar1) {
        operator_delete(local_60._M_dataplus._M_p);
      }
    }
    if (bVar5) {
      puVar4 = (undefined1 *)((long)&flags(pfd::settings::flag)::flags + 5);
    }
    else {
      if (pcVar3 == (char *)0x0) {
        bVar5 = false;
      }
      else {
        local_40[0] = local_30;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"KDE","");
        iVar2 = std::__cxx11::string::compare((char *)local_40);
        bVar5 = iVar2 == 0;
        if (local_40[0] != local_30) {
          operator_delete(local_40[0]);
        }
      }
      if (!bVar5) {
        flags(pfd::settings::flag)::flags._0_1_ = 1;
        return;
      }
      puVar4 = (undefined1 *)((long)&flags(pfd::settings::flag)::flags + 2);
    }
    *puVar4 = 0;
  }
  flags(pfd::settings::flag)::flags._0_1_ = 1;
  return;
}

Assistant:

inline settings::settings(bool resync)
{
    flags(flag::is_scanned) &= !resync;

    if (flags(flag::is_scanned))
        return;

#if _WIN32
    flags(flag::is_vista) = internal::is_vista();
#elif !__APPLE__
    flags(flag::has_zenity) = check_program("zenity");
    flags(flag::has_matedialog) = check_program("matedialog");
    flags(flag::has_qarma) = check_program("qarma");
    flags(flag::has_kdialog) = check_program("kdialog");

    // If multiple helpers are available, try to default to the best one
    if (flags(flag::has_zenity) && flags(flag::has_kdialog))
    {
        auto desktop_name = std::getenv("XDG_SESSION_DESKTOP");
        if (desktop_name && desktop_name == std::string("gnome"))
            flags(flag::has_kdialog) = false;
        else if (desktop_name && desktop_name == std::string("KDE"))
            flags(flag::has_zenity) = false;
    }
#endif

    flags(flag::is_scanned) = true;
}